

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O0

void __thiscall
IncrementalEditDistance::IncrementalEditDistance
          (IncrementalEditDistance *this,string *target,size_t subst_cost,size_t ins_cost,
          size_t del_cost)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  long in_RCX;
  long in_RDX;
  string *in_RSI;
  long *in_RDI;
  long in_R8;
  size_t n;
  ulong local_48;
  allocator local_29;
  long local_28;
  long local_20;
  long local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  in_RDI[6] = local_18;
  in_RDI[7] = local_20;
  in_RDI[8] = local_28;
  lVar3 = std::__cxx11::string::length();
  in_RDI[10] = lVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x11ee76);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI[10] + 1;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *in_RDI = (long)pvVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RDI[10] + 1;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[1] = (long)pvVar5;
  for (local_48 = 0; local_48 <= (ulong)in_RDI[10]; local_48 = local_48 + 1) {
    *(ulong *)(*in_RDI + local_48 * 8) = local_28 * local_48;
  }
  in_RDI[9] = 0;
  return;
}

Assistant:

IncrementalEditDistance(string& target, size_t subst_cost=1, size_t ins_cost=1, size_t del_cost=1)
    : target(target), subst_cost(subst_cost), ins_cost(ins_cost), del_cost(del_cost), N(target.length()), output_string("")
  { prev_row = new size_t[N+1];
    cur_row  = new size_t[N+1];

    for (size_t n=0; n<=N; n++)
      prev_row[n] = del_cost * n;

    prev_row_min = 0;
  }